

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

bool __thiscall QMdiArea::eventFilter(QMdiArea *this,QObject *object,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  undefined4 uVar4;
  QMdiAreaPrivate *pQVar5;
  QMdiArea *pQVar6;
  QWidget *pQVar7;
  QMdiAreaPrivate *pQVar8;
  qsizetype qVar9;
  QEvent *in_RDX;
  long in_RSI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  int tabIndex;
  bool keyPress;
  QMdiArea *area;
  QKeyEvent *keyEvent;
  QMdiAreaPrivate *d;
  QMdiSubWindow *subWindow;
  undefined4 in_stack_ffffffffffffff38;
  KeyboardModifier in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QMdiAreaPrivate *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QWidget *in_stack_ffffffffffffff58;
  QTabBar *in_stack_ffffffffffffff68;
  QEvent *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint increaseFactor;
  bool local_39;
  QIcon local_38 [2];
  QMdiAreaPrivate *in_stack_ffffffffffffffd8;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    local_39 = QAbstractScrollArea::eventFilter
                         ((QAbstractScrollArea *)in_RDI,
                          (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
    goto LAB_006158fa;
  }
  pQVar5 = d_func((QMdiArea *)0x61534f);
  TVar2 = QEvent::type(in_RDX);
  if ((TVar2 == KeyPress) || (TVar2 = QEvent::type(in_RDX), TVar2 == KeyRelease)) {
    QKeyEvent::modifiers();
    local_c.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff3c);
    bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
    increaseFactor = in_stack_ffffffffffffff7c & 0xffffff;
    if (bVar1) {
      iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX);
      increaseFactor = CONCAT13(iVar3 != 0x1000021,(int3)increaseFactor);
    }
    if ((char)(increaseFactor >> 0x18) == '\0') {
      pQVar6 = mdiAreaParent((QWidget *)in_stack_ffffffffffffff48);
      if (pQVar6 == (QMdiArea *)0x0) {
        local_39 = QAbstractScrollArea::eventFilter
                             ((QAbstractScrollArea *)in_RDI,
                              (QObject *)CONCAT44(increaseFactor,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff70);
      }
      else {
        TVar2 = QEvent::type(in_RDX);
        iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX);
        if (iVar3 == 0x1000000) {
          d_func((QMdiArea *)0x615516);
          QMdiAreaPrivate::hideRubberBand
                    ((QMdiAreaPrivate *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        }
        else {
          if (iVar3 + 0xfeffffffU < 2) {
            if (TVar2 == KeyPress) {
              d_func((QMdiArea *)0x6154d1);
              QKeyEvent::key((QKeyEvent *)in_RDX);
              QMdiAreaPrivate::highlightNextSubWindow(in_RDI,increaseFactor);
            }
            local_39 = true;
            goto LAB_006158fa;
          }
          if (iVar3 == 0x1000021) {
            if (TVar2 == KeyPress) {
              d_func((QMdiArea *)0x6154a2);
              QMdiAreaPrivate::startTabToPreviousTimer(in_stack_ffffffffffffff48);
            }
            else {
              d_func((QMdiArea *)0x6154b6);
              QMdiAreaPrivate::activateHighlightedWindow
                        ((QMdiAreaPrivate *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            }
          }
        }
        local_39 = QAbstractScrollArea::eventFilter
                             ((QAbstractScrollArea *)in_RDI,
                              (QObject *)CONCAT44(increaseFactor,iVar3),in_stack_ffffffffffffff70);
      }
    }
    else {
      local_39 = QAbstractScrollArea::eventFilter
                           ((QAbstractScrollArea *)in_RDI,
                            (QObject *)CONCAT44(increaseFactor,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff70);
    }
    goto LAB_006158fa;
  }
  pQVar7 = &qobject_cast<QMdiSubWindow*>((QObject *)0x61554e)->super_QWidget;
  if (pQVar7 != (QWidget *)0x0) {
    pQVar8 = (QMdiAreaPrivate *)QMdiSubWindow::mdiArea((QMdiSubWindow *)in_stack_ffffffffffffff58);
    if (pQVar8 != in_RDI) {
      local_39 = QAbstractScrollArea::eventFilter
                           ((QAbstractScrollArea *)in_RDI,
                            (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                            ,in_stack_ffffffffffffff70);
      goto LAB_006158fa;
    }
    TVar2 = QEvent::type(in_RDX);
    if (TVar2 - Move < 2) {
      if ((pQVar5->tileCalledFromResizeEvent & 1U) == 0) {
        QMdiAreaPrivate::updateScrollBars(in_stack_ffffffffffffffd8);
        bVar1 = QWidget::isMinimized(pQVar7);
        if (!bVar1) {
          pQVar5->isSubWindowsTiled = false;
        }
      }
      goto LAB_006158dd;
    }
    if (TVar2 == Show) {
      if (pQVar5->tabBar != (QMdiAreaTabBar *)0x0) {
        QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                  ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (QMdiSubWindow **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   0x61574e);
        bVar1 = QTabBar::isTabEnabled
                          ((QTabBar *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
        if (!bVar1) {
          QTabBar::setTabEnabled
                    ((QTabBar *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                     SUB81((ulong)in_stack_ffffffffffffff48 >> 0x18,0));
        }
      }
LAB_00615789:
      bVar1 = QEvent::spontaneous(in_RDX);
      if (!bVar1) {
        pQVar5->isSubWindowsTiled = false;
      }
    }
    else {
      if (TVar2 == Hide) goto LAB_00615789;
      if (TVar2 == Close) {
        qVar9 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                          ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (QMdiSubWindow **)
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0x6157c5);
        if (qVar9 == pQVar5->indexToHighlighted) {
          QMdiAreaPrivate::hideRubberBand
                    ((QMdiAreaPrivate *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        }
      }
      else if (TVar2 == WindowTitleChange) {
LAB_006157e5:
        if (pQVar5->tabBar != (QMdiAreaTabBar *)0x0) {
          iVar3 = (int)((ulong)pQVar5->tabBar >> 0x20);
          qVar9 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                            ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (QMdiSubWindow **)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0x615822)
          ;
          uVar4 = (undefined4)qVar9;
          tabTextFor((QMdiSubWindow *)CONCAT44(TVar2,uVar4));
          QTabBar::setTabText((QTabBar *)CONCAT44(TVar2,uVar4),iVar3,
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          QString::~QString((QString *)0x61585e);
        }
      }
      else if (TVar2 == WindowIconChange) {
        if (pQVar5->tabBar != (QMdiAreaTabBar *)0x0) {
          QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                    ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (QMdiSubWindow **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                     ,0x61589d);
          QWidget::windowIcon(in_stack_ffffffffffffff58);
          QTabBar::setTabIcon(in_stack_ffffffffffffff68,TVar2,(QIcon *)in_stack_ffffffffffffff58);
          QIcon::~QIcon(local_38);
        }
      }
      else if (TVar2 == ModifiedChange) goto LAB_006157e5;
    }
LAB_006158dd:
    local_39 = QAbstractScrollArea::eventFilter
                         ((QAbstractScrollArea *)in_RDI,
                          (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
    goto LAB_006158fa;
  }
  TVar2 = QEvent::type(in_RDX);
  if (((TVar2 != ApplicationActivate) ||
      (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x615585), bVar1)) ||
     (bVar1 = QWidget::isVisible((QWidget *)0x615593), !bVar1)) {
LAB_006155bb:
    TVar2 = QEvent::type(in_RDX);
    if ((TVar2 == ApplicationDeactivate) &&
       (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x6155db), bVar1)) {
      ::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x6155fc);
      QMdiAreaPrivate::setActive
                ((QMdiAreaPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (QMdiSubWindow *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 false,false);
    }
  }
  else {
    pQVar7 = QWidget::window((QWidget *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    bVar1 = QWidget::isMinimized(pQVar7);
    if (bVar1) goto LAB_006155bb;
    QMdiAreaPrivate::activateCurrentWindow
              ((QMdiAreaPrivate *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  local_39 = QAbstractScrollArea::eventFilter
                       ((QAbstractScrollArea *)in_RDI,
                        (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70);
LAB_006158fa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QMdiArea::eventFilter(QObject *object, QEvent *event)
{
    if (!object)
        return QAbstractScrollArea::eventFilter(object, event);

    Q_D(QMdiArea);
    // Global key events with Ctrl modifier.
    if (event->type() == QEvent::KeyPress || event->type() == QEvent::KeyRelease) {

        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        // Ignore key events without a Ctrl modifier (except for press/release on the modifier itself).
        if (!(keyEvent->modifiers() & Qt::ControlModifier) && keyEvent->key() != Qt::Key_Control)
            return QAbstractScrollArea::eventFilter(object, event);

        // Find closest mdi area (in case we have a nested workspace).
        QMdiArea *area = mdiAreaParent(static_cast<QWidget *>(object));
        if (!area)
            return QAbstractScrollArea::eventFilter(object, event);

        const bool keyPress = (event->type() == QEvent::KeyPress);

        // 1) Ctrl-Tab once -> activate the previously active window.
        // 2) Ctrl-Tab (Tab, Tab, ...) -> iterate through all windows (activateNextSubWindow()).
        // 3) Ctrl-Shift-Tab (Tab, Tab, ...) -> iterate through all windows in the opposite
        //    direction (activatePreviousSubWindow())
        switch (keyEvent->key()) {
        case Qt::Key_Control:
            if (keyPress)
                area->d_func()->startTabToPreviousTimer();
            else
                area->d_func()->activateHighlightedWindow();
            break;
        case Qt::Key_Tab:
        case Qt::Key_Backtab:
            if (keyPress)
                area->d_func()->highlightNextSubWindow(keyEvent->key() == Qt::Key_Tab ? 1 : -1);
            return true;
#if QT_CONFIG(rubberband)
        case Qt::Key_Escape:
            area->d_func()->hideRubberBand();
            break;
#endif
        default:
            break;
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    QMdiSubWindow *subWindow = qobject_cast<QMdiSubWindow *>(object);

    if (!subWindow) {
        // QApplication events:
        if (event->type() == QEvent::ApplicationActivate && !d->active
            && isVisible() && !window()->isMinimized()) {
            d->activateCurrentWindow();
        } else if (event->type() == QEvent::ApplicationDeactivate && d->active) {
            d->setActive(d->active, false, false);
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    if (subWindow->mdiArea() != this)
        return QAbstractScrollArea::eventFilter(object, event);

    // QMdiSubWindow events:
    switch (event->type()) {
    case QEvent::Move:
    case QEvent::Resize:
        if (d->tileCalledFromResizeEvent)
            break;
        d->updateScrollBars();
        if (!subWindow->isMinimized())
            d->isSubWindowsTiled = false;
        break;
    case QEvent::Show:
#if QT_CONFIG(tabbar)
        if (d->tabBar) {
            const int tabIndex = d->childWindows.indexOf(subWindow);
            if (!d->tabBar->isTabEnabled(tabIndex))
                d->tabBar->setTabEnabled(tabIndex, true);
        }
#endif // QT_CONFIG(tabbar)
        Q_FALLTHROUGH();
    case QEvent::Hide:
        // Do not reset the isSubWindowsTiled flag if the event is a spontaneous system window event.
        // This ensures that tiling will be performed during the resizeEvent after an application
        // window minimize (hide) and then restore (show).
        if (!event->spontaneous())
            d->isSubWindowsTiled = false;
        break;
#if QT_CONFIG(rubberband)
    case QEvent::Close:
        if (d->childWindows.indexOf(subWindow) == d->indexToHighlighted)
            d->hideRubberBand();
        break;
#endif
#if QT_CONFIG(tabbar)
    case QEvent::WindowTitleChange:
    case QEvent::ModifiedChange:
        if (d->tabBar)
            d->tabBar->setTabText(d->childWindows.indexOf(subWindow), tabTextFor(subWindow));
        break;
    case QEvent::WindowIconChange:
        if (d->tabBar)
            d->tabBar->setTabIcon(d->childWindows.indexOf(subWindow), subWindow->windowIcon());
        break;
#endif // QT_CONFIG(tabbar)
    default:
        break;
    }
    return QAbstractScrollArea::eventFilter(object, event);
}